

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder * __thiscall
capnp::_::PointerBuilder::initStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size)

{
  PointerBuilder *this_local;
  StructSize size_local;
  
  WireHelpers::initStructPointer
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,size,
             (BuilderArena *)0x0);
  return __return_storage_ptr__;
}

Assistant:

StructBuilder PointerBuilder::initStruct(StructSize size) {
  return WireHelpers::initStructPointer(pointer, segment, capTable, size);
}